

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnection::onlineStateChanged(QHttpNetworkConnection *this,bool isOnline)

{
  QHttpNetworkConnectionChannel *pQVar1;
  QHttpNetworkConnectionPrivate *pQVar2;
  byte in_SIL;
  int __fd;
  QHttpNetworkConnectionChannel *channel;
  int i;
  QHttpNetworkConnectionPrivate *d;
  undefined3 in_stack_0000001c;
  int local_1c;
  
  pQVar2 = d_func((QHttpNetworkConnection *)0x2f0480);
  if ((in_SIL & 1) == 0) {
    for (local_1c = 0; local_1c < pQVar2->activeChannelCount; local_1c = local_1c + 1) {
      pQVar1 = pQVar2->channels;
      __fd = 7;
      QHttpNetworkConnectionChannel::emitFinishedWithError
                ((QHttpNetworkConnectionChannel *)this,_in_stack_0000001c,(char *)d);
      QHttpNetworkConnectionChannel::close
                ((QHttpNetworkConnectionChannel *)(pQVar1 + local_1c),__fd);
    }
    QNetworkConnectionMonitor::stopMonitoring(&pQVar2->connectionMonitor);
  }
  return;
}

Assistant:

void QHttpNetworkConnection::onlineStateChanged(bool isOnline)
{
    Q_D(QHttpNetworkConnection);

    if (isOnline) {
        // If we did not have any 'isOffline' previously - well, good
        // to know, we are 'online' apparently.
        return;
    }

    for (int i = 0; i < d->activeChannelCount; i++) {
        auto &channel = d->channels[i];
        channel.emitFinishedWithError(QNetworkReply::TemporaryNetworkFailureError, "Temporary network failure.");
        channel.close();
    }

    // We don't care, this connection is broken from our POV.
    d->connectionMonitor.stopMonitoring();
}